

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_server.c
# Opt level: O2

void mk_server_worker_loop(mk_server *server)

{
  mk_event_loop *loop;
  mk_list *pmVar1;
  mk_list *pmVar2;
  int iVar3;
  int iVar4;
  mk_sched_worker *sched;
  ssize_t sVar5;
  void *pvVar6;
  void *pvVar7;
  int *piVar8;
  char *pcVar9;
  uint uVar10;
  int line;
  int line_00;
  mk_list *__mptr;
  long lVar11;
  uint64_t *puVar12;
  mk_list *pmVar13;
  mk_sched_conn *unaff_R13;
  long lVar14;
  uint64_t val;
  uint64_t local_40;
  void *local_38;
  
  sched = (mk_sched_worker *)pthread_getspecific(mk_tls_sched_worker_node);
  loop = sched->loop;
  mk_event_wait(loop);
  pvVar7 = loop->data;
  iVar3 = loop->n_events;
  if (0 < iVar3) {
    unaff_R13 = *(mk_sched_conn **)(*(long *)((long)pvVar7 + 8) + 4);
  }
  lVar14 = 0x10;
  local_40 = 0xeeeeeeee;
  for (lVar11 = 0; lVar11 < iVar3; lVar11 = lVar11 + 1) {
    if (((((unaff_R13->event).mask & 1) != 0) && ((unaff_R13->event).type == 0)) &&
       (iVar3 = (unaff_R13->event).fd, iVar3 == sched->signal_channel_r)) {
      puVar12 = &val;
      sVar5 = read(iVar3,puVar12,8);
      if ((int)sVar5 < 0) {
        mk_utils_libc_error((char *)0x1d6,(char *)puVar12,line);
      }
      else if (val == 0xeeeeeeee) break;
    }
    iVar3 = loop->n_events;
    if ((int)lVar11 + 1 < iVar3) {
      unaff_R13 = *(mk_sched_conn **)(*(long *)((long)pvVar7 + 8) + lVar14);
    }
    else {
      unaff_R13 = (mk_sched_conn *)0x0;
    }
    lVar14 = lVar14 + 0xc;
  }
  if (server->scheduler_mode == '\x01') {
    pvVar6 = pthread_getspecific(mk_tls_server_listen);
    pvVar7 = pvVar6;
    while (pvVar7 = *(void **)((long)pvVar7 + 8), pvVar7 != pvVar6) {
      mk_event_add(sched->loop,*(int *)((long)pvVar7 + -0x20),1,1,(void *)((long)pvVar7 + -0x68));
    }
  }
  if (((server->lib_mode == 1) &&
      (pvVar7 = pthread_getspecific(mk_server_fifo_key), pvVar7 != (void *)0x0)) &&
     (iVar3 = mk_event_add(loop,*(int *)((long)pvVar7 + 0x4c),2,1,pvVar7), iVar3 != 0)) {
    piVar8 = __errno_location();
    pcVar9 = strerror(*piVar8);
    mk_print(0x1001,"[server] Error registering fifo worker channel: %s",pcVar9);
  }
  pvVar7 = mk_mem_alloc_z(0x48);
  pthread_setspecific(mk_tls_server_timeout,pvVar7);
  local_38 = pvVar7;
  iVar3 = mk_event_timeout_create(loop,(long)server->timeout,0,pvVar7);
  local_40 = local_40 + 0x10ff1112;
  do {
    mk_event_wait(loop);
    pvVar7 = loop->data;
    iVar4 = loop->n_events;
    if (0 < iVar4) {
      unaff_R13 = *(mk_sched_conn **)(*(long *)((long)pvVar7 + 8) + 4);
    }
    lVar14 = 0x10;
    for (lVar11 = 0; lVar11 < iVar4; lVar11 = lVar11 + 1) {
      uVar10 = (unaff_R13->event).type;
      if ((uVar10 & 0x18) == 0) {
        switch(uVar10) {
        case 0:
          puVar12 = &val;
          sVar5 = read((unaff_R13->event).fd,puVar12,8);
          if ((int)sVar5 < 0) {
            mk_utils_libc_error((char *)0x238,(char *)puVar12,line_00);
          }
          else {
            iVar4 = (unaff_R13->event).fd;
            if (iVar4 == sched->signal_channel_r) {
              if (val == local_40) {
                if (0 < iVar3) {
                  mk_event_timeout_destroy(loop,local_38);
                }
                pvVar7 = pthread_getspecific(mk_tls_server_timeout);
                free(pvVar7);
                mk_server_listen_exit(sched->listeners);
                mk_event_loop_destroy(loop);
                mk_sched_worker_free(server);
                return;
              }
            }
            else if (iVar4 == iVar3) {
              mk_sched_check_timeouts(sched,server);
            }
          }
          break;
        case 1:
          mk_server_listen_handler(sched,unaff_R13,server);
          break;
        case 2:
          mk_fifo_worker_read(unaff_R13);
          break;
        case 3:
          uVar10 = (unaff_R13->event).mask;
          iVar4 = 0;
          if ((uVar10 & 4) != 0) {
            iVar4 = mk_sched_event_write(unaff_R13,sched,server);
            uVar10 = (unaff_R13->event).mask;
          }
          if ((uVar10 & 1) != 0) {
            iVar4 = mk_sched_event_read(unaff_R13,sched,server);
            uVar10 = (unaff_R13->event).mask;
          }
          if ((((uVar10 & 0x2018) != 0) || (iVar4 < 0)) && (unaff_R13->status != -2)) {
            mk_sched_event_close(unaff_R13,sched,0,server);
          }
          break;
        case 4:
          (*(unaff_R13->event).handler)(unaff_R13);
          break;
        case 5:
          mk_http_thread_event(&unaff_R13->event);
        }
      }
      iVar4 = loop->n_events;
      if ((int)lVar11 + 1 < iVar4) {
        unaff_R13 = *(mk_sched_conn **)(*(long *)((long)pvVar7 + 8) + lVar14);
      }
      else {
        unaff_R13 = (mk_sched_conn *)0x0;
      }
      lVar14 = lVar14 + 0xc;
    }
    mk_sched_threads_purge(sched);
    pmVar13 = (sched->event_free_queue).next;
    while (pmVar13 != &sched->event_free_queue) {
      pmVar1 = pmVar13->prev;
      pmVar2 = pmVar13->next;
      pmVar1->next = pmVar2;
      pmVar2->prev = pmVar1;
      pmVar13->prev = (mk_list *)0x0;
      pmVar13->next = (mk_list *)0x0;
      free(pmVar13 + -2);
      pmVar13 = pmVar2;
    }
  } while( true );
}

Assistant:

void mk_server_worker_loop(struct mk_server *server)
{
    int ret = -1;
    int timeout_fd;
    uint64_t val;
    struct mk_event *event;
    struct mk_event_loop *evl;
    struct mk_list *list;
    struct mk_list *head;
    struct mk_sched_conn *conn;
    struct mk_sched_worker *sched;
    struct mk_server_listen *listener;
    struct mk_server_timeout *server_timeout;

    /* Get thread conf */
    sched = mk_sched_get_thread_conf();
    evl = sched->loop;

    /*
     * The worker will NOT process any connection until the master
     * process through mk_server_loop() send us the green light
     * signal MK_SERVER_SIGNAL_START.
     */
    mk_event_wait(evl);
    mk_event_foreach(event, evl) {
        if ((event->mask & MK_EVENT_READ) &&
            event->type == MK_EVENT_NOTIFICATION) {
            if (event->fd == sched->signal_channel_r) {
        /* When using libevent _mk_event_channel_create creates a unix socket
         * instead of a pipe and windows doesn't us calling read / write on a
         * socket instead of recv / send
         */
#ifdef _WIN32
                ret = recv(event->fd, &val, sizeof(val), MSG_WAITALL);
#else
                ret = read(event->fd, &val, sizeof(val));
#endif
                if (ret < 0) {
                    mk_libc_error("read");
                    continue;
                }
                if (val == MK_SERVER_SIGNAL_START) {
                    MK_TRACE("Worker %i started (SIGNAL_START)", sched->idx);
                    break;
                }
            }
        }
    }

    if (server->scheduler_mode == MK_SCHEDULER_REUSEPORT) {
        /* Register listeners */
        list = MK_TLS_GET(mk_tls_server_listen);
        mk_list_foreach(head, list) {
            listener = mk_list_entry(head, struct mk_server_listen, _head);
            mk_event_add(sched->loop, listener->server_fd,
                         MK_EVENT_LISTENER, MK_EVENT_READ,
                         listener);
        }
    }

    /*
     * If running in library mode, register the FIFO pipe file descriptors
     * into the main event loop.
     */
    if (server->lib_mode == MK_TRUE) {
        mk_server_fifo_worker_setup(evl);
    }

    /* create a new timeout file descriptor */
    server_timeout = mk_mem_alloc_z(sizeof(struct mk_server_timeout));
    MK_TLS_SET(mk_tls_server_timeout, server_timeout);
    timeout_fd = mk_event_timeout_create(evl, server->timeout, 0, server_timeout);

    while (1) {
        mk_event_wait(evl);
        mk_event_foreach(event, evl) {
            ret = 0;
            if (event->type & MK_EVENT_IDLE) {
                continue;
            }

            if (event->type == MK_EVENT_CONNECTION) {
                conn = (struct mk_sched_conn *) event;

                if (event->mask & MK_EVENT_WRITE) {
                    MK_TRACE("[FD %i] Event WRITE", event->fd);
                    ret = mk_sched_event_write(conn, sched, server);
                }

                if (event->mask & MK_EVENT_READ) {
                    MK_TRACE("[FD %i] Event READ", event->fd);
                    ret = mk_sched_event_read(conn, sched, server);
                }


                if (event->mask & MK_EVENT_CLOSE && ret != -1) {
                    MK_TRACE("[FD %i] Event CLOSE", event->fd);
                    ret = -1;
                }

                if (ret < 0 && conn->status != MK_SCHED_CONN_CLOSED) {
                    MK_TRACE("[FD %i] Event FORCE CLOSE | ret = %i",
                             event->fd, ret);
                    mk_sched_event_close(conn, sched, MK_EP_SOCKET_CLOSED,
                                         server);
                }
            }
            else if (event->type == MK_EVENT_LISTENER) {
                /*
                 * A new connection have been accepted..or failed, despite
                 * the result, we let the loop continue processing the other
                 * events triggered.
                 */
                conn = mk_server_listen_handler(sched, event, server);
                if (conn) {
                    //conn->event.mask = MK_EVENT_READ
                    //goto speed;
                }
                continue;
            }
            else if (event->type == MK_EVENT_CUSTOM) {
                /*
                 * We got an event associated to a custom interface, that
                 * means a plugin registered some file descriptor on this
                 * event loop and an event was triggered. We pass the control
                 * to the defined event handler.
                 */
                event->handler(event);
            }
            else if (event->type == MK_EVENT_NOTIFICATION) {
#ifdef _WIN32
                ret = recv(event->fd, &val, sizeof(val), MSG_WAITALL);
#else
                ret = read(event->fd, &val, sizeof(val));
#endif
                if (ret < 0) {
                    mk_libc_error("read");
                    continue;
                }

                if (event->fd == sched->signal_channel_r) {
                    if (val == MK_SCHED_SIGNAL_DEADBEEF) {
                        //FIXME:mk_sched_sync_counters();
                        continue;
                    }
                    else if (val == MK_SCHED_SIGNAL_FREE_ALL) {
                        if (timeout_fd > 0) {
                            mk_event_timeout_destroy(evl, server_timeout);
                        }
                        mk_mem_free(MK_TLS_GET(mk_tls_server_timeout));
                        mk_server_listen_exit(sched->listeners);
                        mk_event_loop_destroy(evl);
                        mk_sched_worker_free(server);
                        return;
                    }
                    else if (val == MK_SCHED_SIGNAL_EVENT_LOOP_BREAK) {
                        /* NOTE: This is just a notification that's sent to break out
                         *       of the libevent loop in windows after accepting a new
                         *       client
                        */
                        MK_TRACE("New client accepted, awesome!");
                    }
                }
                else if (event->fd == timeout_fd) {
                    mk_sched_check_timeouts(sched, server);
                }
                continue;
            }
            else if (event->type == MK_EVENT_THREAD) {
                mk_http_thread_event(event);
                continue;
            }
            else if (event->type == MK_EVENT_FIFO) {
                mk_fifo_worker_read(event);
                continue;
            }
        }
        mk_sched_threads_purge(sched);
        mk_sched_event_free_all(sched);
    }
}